

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O1

void __thiscall
AVSInterface::AVSInDelegator::Read
          (AVSInDelegator *this,char *name,vector<int,_std::allocator<int>_> *output)

{
  pointer piVar1;
  iterator __position;
  char cVar2;
  int iVar3;
  int iVar4;
  AVSValue *pAVar5;
  code *pcVar6;
  undefined8 *puVar7;
  int iVar8;
  long *plVar9;
  AVSValue arg;
  int local_44;
  AVSValue local_40;
  
  pAVar5 = &this->_args;
  iVar3 = NameToIndex(this,name);
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x508 < (uint)AVS_linkage->Size)) {
    pcVar6 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
    plVar9 = (long *)((long)&pAVar5->type + *(long *)&AVS_linkage->field_0x510);
    if (((ulong)pcVar6 & 1) != 0) {
      pcVar6 = *(code **)(pcVar6 + *plVar9 + -1);
    }
    pAVar5 = (AVSValue *)(*pcVar6)(plVar9,iVar3);
  }
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x4d8 < (uint)AVS_linkage->Size)) {
    pcVar6 = (code *)AVS_linkage->AVSValue_CONSTRUCTOR9;
    plVar9 = (long *)((long)&local_40.type + *(long *)&AVS_linkage->field_0x4e0);
    if (((ulong)pcVar6 & 1) != 0) {
      pcVar6 = *(code **)(pcVar6 + *plVar9 + -1);
    }
    (*pcVar6)(plVar9,pAVar5);
  }
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x578 < (uint)AVS_linkage->Size)) {
    pcVar6 = (code *)AVS_linkage->IsArray;
    if (((ulong)pcVar6 & 1) != 0) {
      pcVar6 = *(code **)(pcVar6 + *(long *)((long)&local_40.type +
                                            *(long *)&AVS_linkage->field_0x580) + -1);
    }
    cVar2 = (*pcVar6)();
    if (cVar2 != '\0') {
      iVar3 = 0;
      if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x628 < (uint)AVS_linkage->Size)) {
        pcVar6 = (code *)AVS_linkage->ArraySize;
        if (((ulong)pcVar6 & 1) != 0) {
          pcVar6 = *(code **)(pcVar6 + *(long *)((long)&local_40.type +
                                                *(long *)&AVS_linkage->field_0x630) + -1);
        }
        iVar3 = (*pcVar6)();
      }
      piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish != piVar1) {
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = piVar1;
      }
      if (0 < iVar3) {
        iVar8 = 0;
        do {
          pAVar5 = &local_40;
          if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x508 < (uint)AVS_linkage->Size)) {
            pcVar6 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
            plVar9 = (long *)((long)&local_40.type + *(long *)&AVS_linkage->field_0x510);
            if (((ulong)pcVar6 & 1) != 0) {
              pcVar6 = *(code **)(pcVar6 + *plVar9 + -1);
            }
            pAVar5 = (AVSValue *)(*pcVar6)(plVar9,iVar8);
          }
          iVar4 = 0;
          if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x5a8 < (uint)AVS_linkage->Size)) {
            pcVar6 = (code *)AVS_linkage->AsInt1;
            plVar9 = (long *)((long)&pAVar5->type + *(long *)&AVS_linkage->field_0x5b0);
            if (((ulong)pcVar6 & 1) != 0) {
              pcVar6 = *(code **)(pcVar6 + *plVar9 + -1);
            }
            iVar4 = (*pcVar6)(plVar9);
          }
          __position._M_current =
               (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          local_44 = iVar4;
          if (__position._M_current ==
              (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (output,__position,&local_44);
          }
          else {
            *__position._M_current = iVar4;
            (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
          iVar8 = iVar8 + 1;
        } while (iVar3 != iVar8);
      }
      AVSValue::~AVSValue(&local_40);
      return;
    }
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = "Argument is not array";
  __cxa_throw(puVar7,&char_const*::typeinfo,0);
}

Assistant:

void Read(const char* name, std::vector<int>& output) override {
      auto arg = _args[NameToIndex(name)];
      if (!arg.IsArray())
        throw "Argument is not array";
      auto size = arg.ArraySize();
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(arg[i].AsInt());
    }